

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O0

void __thiscall Centaurus::ATNNode<unsigned_char>::~ATNNode(ATNNode<unsigned_char> *this)

{
  ATNNode<unsigned_char> *this_local;
  
  ~ATNNode(this);
  operator_delete(this);
  return;
}

Assistant:

void add_transition(const ATNTransition<TCHAR>& transition)
    {
        m_transitions.push_back(transition);
    }